

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
VulkanHppGenerator::generateRAIIHandleConstructor1Return2Vector
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,const_iterator constructorIt,string *enter,string *leave,size_t returnParam,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  int iVar5;
  long lVar6;
  VulkanHppGenerator *this_00;
  string singularConstructor;
  string local_70;
  string local_50;
  
  p_Var2 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar6 = std::_Rb_tree_increment(p_Var2);
  if (*(size_t *)(lVar6 + 0x20) == returnParam) {
    p_Var3 = p_Var2[1]._M_parent;
    lVar6 = std::_Rb_tree_increment(p_Var2);
    if ((((p_Var3 == *(_Base_ptr *)(lVar6 + 0x28)) &&
         (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)constructorIt._M_node[5]._M_parent + (long)p_Var3 * 0x108 + 0x20),
                          "uint32_t"), iVar5 == 0)) &&
        (iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)constructorIt._M_node[5]._M_parent +
                         *(long *)((vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                   _M_left + 1) * 0x108 + 0x20),"void"), iVar5 != 0)) &&
       (this_00 = this,
       bVar4 = isHandleType(this,(string *)
                                 ((long)constructorIt._M_node[5]._M_parent +
                                 *(long *)((vectorParams->_M_t)._M_impl.super__Rb_tree_header.
                                           _M_header._M_left + 1) * 0x108 + 0x20)), !bVar4)) {
      singularConstructor._M_string_length = 0;
      singularConstructor.field_2._M_local_buf[0] = '\0';
      singularConstructor._M_dataplus._M_p = (pointer)&singularConstructor.field_2;
      bVar4 = checkEquivalentSingularConstructor
                        (this_00,&(handle->second).constructorIts,constructorIt,
                         (ParamData *)
                         ((long)(vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                                [1]._M_parent * 0x108 + (long)constructorIt._M_node[5]._M_parent));
      if (!bVar4) {
        generateRAIIHandleConstructorByCall
                  (&local_50,this,handle,constructorIt,enter,leave,true,true);
        generateRAIIHandleConstructor1Return2Vector();
      }
      generateRAIIHandleConstructorByCall
                (&local_70,this,handle,constructorIt,enter,leave,true,false);
      (__return_storage_ptr__->first)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->first).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,singularConstructor._M_dataplus._M_p,
                 singularConstructor._M_dataplus._M_p + singularConstructor._M_string_length);
      paVar1 = &(__return_storage_ptr__->second).field_2;
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        paVar1->_M_allocated_capacity = local_70.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) =
             local_70.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->second)._M_dataplus._M_p = local_70._M_dataplus._M_p;
        (__return_storage_ptr__->second).field_2._M_allocated_capacity =
             local_70.field_2._M_allocated_capacity;
      }
      (__return_storage_ptr__->second)._M_string_length = local_70._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)singularConstructor._M_dataplus._M_p == &singularConstructor.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(singularConstructor._M_dataplus._M_p,
                      CONCAT71(singularConstructor.field_2._M_allocated_capacity._1_7_,
                               singularConstructor.field_2._M_local_buf[0]) + 1);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string>
  VulkanHppGenerator::generateRAIIHandleConstructor1Return2Vector( std::pair<std::string, HandleData> const &         handle,
                                                                   std::map<std::string, CommandData>::const_iterator constructorIt,
                                                                   std::string const &                                enter,
                                                                   std::string const &                                leave,
                                                                   size_t                                             returnParam,
                                                                   std::map<size_t, VectorParamData> const &          vectorParams ) const
{
  if ( returnParam == std::next( vectorParams.begin() )->first )
  {
    if ( vectorParams.begin()->second.lenParam == std::next( vectorParams.begin() )->second.lenParam )
    {
      if ( constructorIt->second.params[vectorParams.begin()->second.lenParam].type.type == "uint32_t" )
      {
        if ( ( constructorIt->second.params[vectorParams.begin()->first].type.type != "void" ) &&
             !isHandleType( constructorIt->second.params[vectorParams.begin()->first].type.type ) )
        {
          std::string singularConstructor;
          auto        lenParamIt = constructorIt->second.params.begin() + vectorParams.begin()->second.lenParam;
          if ( !checkEquivalentSingularConstructor( handle.second.constructorIts, constructorIt, lenParamIt ) )
          {
            singularConstructor = generateRAIIHandleConstructorByCall( handle, constructorIt, enter, leave, true, true );
          }
          return { singularConstructor, generateRAIIHandleConstructorByCall( handle, constructorIt, enter, leave, true, false ) };
        }
      }
    }
  }
  return {};
}